

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

bool AI::areAdjacent(Task *a,Task *b)

{
  byte bVar1;
  bool bVar2;
  pointer pRVar3;
  vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_> *this;
  pointer pRVar4;
  vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_> *this_00;
  reference pSVar5;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *pvVar6;
  reference pCVar7;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_1f0;
  ConsumableFact *local_1e8;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_1e0;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_1d8;
  ConsumableFact local_1cc;
  iterator iStack_1c8;
  ConsumableFact vector;
  iterator __end1_5;
  iterator __begin1_5;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_5;
  ConsumableFact *local_1a8;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_1a0;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_198;
  ConsumableFact local_18c;
  iterator iStack_188;
  ConsumableFact value_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_4;
  ConsumableFact *local_168;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_160;
  __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
  local_158;
  ConsumableFact local_14c;
  iterator iStack_148;
  ConsumableFact flag_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> *__range1_3;
  __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
  *local_128;
  SatisfiablePredicateParams *local_120;
  __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
  local_118;
  __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
  local_110;
  __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
  *local_108;
  __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
  *it;
  SatisfiablePredicateParams satisfiedPredicate;
  iterator __end1_2;
  iterator __begin1_2;
  vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  *__range1_2;
  RequiredValue *local_d4;
  undefined4 local_cc;
  RequiredValue *local_c4;
  undefined4 local_bc;
  RequiredValue *local_b8;
  __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
  local_b0;
  __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
  local_a8;
  __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
  *local_a0;
  __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
  *matchingValue;
  RequiredValue *value;
  iterator __end1_1;
  iterator __begin1_1;
  vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_> *__range1_1;
  RequiredFlag local_70;
  RequiredFlag *local_68;
  __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
  local_60;
  __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
  local_58;
  __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
  *local_50;
  __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
  *matchingFlag;
  RequiredFlag *flag;
  iterator __end1;
  iterator __begin1;
  vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *__range1;
  Condition *precondition;
  Task *b_local;
  Task *a_local;
  
  __end1 = std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::begin
                     ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)a);
  flag = (RequiredFlag *)
         std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::end
                   ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)a);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                                *)&flag);
    if (!bVar2) {
      this = &(a->preconditions).requiredValues;
      __end1_1 = std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::begin(this);
      value = (RequiredValue *)
              std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>::end(this);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                                 *)&value), bVar2) {
        matchingValue =
             (__normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
              *)__gnu_cxx::
                __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                ::operator*(&__end1_1);
        local_b0._M_current =
             (RequiredValue *)
             std::begin<std::vector<AI::RequiredValue,std::allocator<AI::RequiredValue>>>
                       (&(b->postconditions).requiredValues);
        local_b8 = (RequiredValue *)
                   std::end<std::vector<AI::RequiredValue,std::allocator<AI::RequiredValue>>>
                             (&(b->postconditions).requiredValues);
        local_d4 = matchingValue->_M_current;
        local_cc = *(undefined4 *)&matchingValue[1]._M_current;
        local_c4 = local_d4;
        local_bc = local_cc;
        local_a8 = std::
                   find_if<__gnu_cxx::__normal_iterator<AI::RequiredValue*,std::vector<AI::RequiredValue,std::allocator<AI::RequiredValue>>>,AI::areAdjacent(AI::Task&,AI::Task&)::__1>
                             (local_b0,(__normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                                        )local_b8,
                              (anon_class_12_1_a8c68091_for__M_pred)*(RequiredValue *)matchingValue)
        ;
        local_a0 = &local_a8;
        __range1_2 = (vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                      *)std::end<std::vector<AI::RequiredValue,std::allocator<AI::RequiredValue>>>
                                  (&(b->postconditions).requiredValues);
        bVar2 = __gnu_cxx::operator!=
                          (&local_a8,
                           (__normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                            *)&__range1_2);
        if (bVar2) {
          pRVar4 = __gnu_cxx::
                   __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                   ::operator->(local_a0);
          switch(pRVar4->op) {
          case LessThan:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canLessThanSatisfy(pRVar4->value,
                                       *(ConditionOp *)((long)&matchingValue->_M_current + 4),
                                       *(float *)&matchingValue[1]._M_current);
            return bVar2;
          case LessEqual:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canLessEqualSatisfy(pRVar4->value,
                                        *(ConditionOp *)((long)&matchingValue->_M_current + 4),
                                        *(float *)&matchingValue[1]._M_current);
            return bVar2;
          case EqualTo:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canEqualToSatisfy(pRVar4->value,
                                      *(ConditionOp *)((long)&matchingValue->_M_current + 4),
                                      *(float *)&matchingValue[1]._M_current);
            return bVar2;
          case NotEqualTo:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canNotEqualToSatisfy
                              (pRVar4->value,*(ConditionOp *)((long)&matchingValue->_M_current + 4),
                               *(float *)&matchingValue[1]._M_current);
            return bVar2;
          case GreaterThan:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canGreaterThanSatisfy
                              (pRVar4->value,*(ConditionOp *)((long)&matchingValue->_M_current + 4),
                               *(float *)&matchingValue[1]._M_current);
            return bVar2;
          case GreaterEqual:
            pRVar4 = __gnu_cxx::
                     __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
                     ::operator->(local_a0);
            bVar2 = canGreaterEqualSatisfy
                              (pRVar4->value,*(ConditionOp *)((long)&matchingValue->_M_current + 4),
                               *(float *)&matchingValue[1]._M_current);
            return bVar2;
          }
        }
        __gnu_cxx::
        __normal_iterator<AI::RequiredValue_*,_std::vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>_>
        ::operator++(&__end1_1);
      }
      this_00 = &(a->preconditions).satisfiedPredicates;
      __end1_2 = std::
                 vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
                 ::begin(this_00);
      satisfiedPredicate =
           (SatisfiablePredicateParams)
           std::
           vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
           end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                                 *)&satisfiedPredicate), bVar2) {
        pSVar5 = __gnu_cxx::
                 __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                 ::operator*(&__end1_2);
        it = *(__normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
               **)pSVar5;
        local_118._M_current =
             (SatisfiablePredicateParams *)
             std::
             begin<std::vector<AI::SatisfiablePredicateParams,std::allocator<AI::SatisfiablePredicateParams>>>
                       (&(b->postconditions).satisfiedPredicates);
        local_120 = (SatisfiablePredicateParams *)
                    std::
                    end<std::vector<AI::SatisfiablePredicateParams,std::allocator<AI::SatisfiablePredicateParams>>>
                              (&(b->postconditions).satisfiedPredicates);
        local_128 = it;
        local_110 = std::
                    find_if<__gnu_cxx::__normal_iterator<AI::SatisfiablePredicateParams*,std::vector<AI::SatisfiablePredicateParams,std::allocator<AI::SatisfiablePredicateParams>>>,AI::areAdjacent(AI::Task&,AI::Task&)::__2>
                              (local_118,
                               (__normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                                )local_120,(anon_class_8_1_27538863_for__M_pred)it);
        local_108 = &local_110;
        __range1_3 = (vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
                     std::
                     end<std::vector<AI::SatisfiablePredicateParams,std::allocator<AI::SatisfiablePredicateParams>>>
                               (&(b->postconditions).satisfiedPredicates);
        bVar2 = __gnu_cxx::operator!=
                          (&local_110,
                           (__normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
                            *)&__range1_3);
        if (bVar2) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<AI::SatisfiablePredicateParams_*,_std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>_>
        ::operator++(&__end1_2);
      }
      pvVar6 = &(a->preconditions).consumableFlags;
      __end1_3 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin(pvVar6);
      iStack_148 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffffeb8), bVar2) {
        pCVar7 = __gnu_cxx::
                 __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                 ::operator*(&__end1_3);
        local_14c = *pCVar7;
        local_160._M_current =
             (ConsumableFact *)
             std::begin<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                       (&(b->postconditions).consumableFlags);
        local_168 = (ConsumableFact *)
                    std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                              (&(b->postconditions).consumableFlags);
        local_158 = std::
                    find<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,ConsumableFact>
                              (local_160,
                               (__normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                                )local_168,&local_14c);
        __range1_4 = (vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
                     std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                               (&(b->postconditions).consumableFlags);
        bVar2 = __gnu_cxx::operator!=
                          (&local_158,
                           (__normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                            *)&__range1_4);
        if (bVar2) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
        ::operator++(&__end1_3);
      }
      pvVar6 = &(a->preconditions).consumableValues;
      __end1_4 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin(pvVar6);
      iStack_188 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end(pvVar6);
      while (bVar2 = __gnu_cxx::operator!=(&__end1_4,&stack0xfffffffffffffe78), bVar2) {
        pCVar7 = __gnu_cxx::
                 __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                 ::operator*(&__end1_4);
        local_18c = *pCVar7;
        local_1a0._M_current =
             (ConsumableFact *)
             std::begin<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                       (&(b->postconditions).consumableValues);
        local_1a8 = (ConsumableFact *)
                    std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                              (&(b->postconditions).consumableValues);
        local_198 = std::
                    find<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,ConsumableFact>
                              (local_1a0,
                               (__normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                                )local_1a8,&local_18c);
        __range1_5 = (vector<ConsumableFact,_std::allocator<ConsumableFact>_> *)
                     std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                               (&(b->postconditions).consumableValues);
        bVar2 = __gnu_cxx::operator!=
                          (&local_198,
                           (__normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                            *)&__range1_5);
        if (bVar2) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
        ::operator++(&__end1_4);
      }
      pvVar6 = &(a->preconditions).consumableVectors;
      __end1_5 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::begin(pvVar6);
      iStack_1c8 = std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::end(pvVar6);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&__end1_5,&stack0xfffffffffffffe38);
        if (!bVar2) {
          return false;
        }
        pCVar7 = __gnu_cxx::
                 __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                 ::operator*(&__end1_5);
        local_1cc = *pCVar7;
        local_1e0._M_current =
             (ConsumableFact *)
             std::begin<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                       (&(b->postconditions).consumableVectors);
        local_1e8 = (ConsumableFact *)
                    std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                              (&(b->postconditions).consumableVectors);
        local_1d8 = std::
                    find<__gnu_cxx::__normal_iterator<ConsumableFact*,std::vector<ConsumableFact,std::allocator<ConsumableFact>>>,ConsumableFact>
                              (local_1e0,
                               (__normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
                                )local_1e8,&local_1cc);
        local_1f0._M_current =
             (ConsumableFact *)
             std::end<std::vector<ConsumableFact,std::allocator<ConsumableFact>>>
                       (&(b->postconditions).consumableVectors);
        bVar2 = __gnu_cxx::operator!=(&local_1d8,&local_1f0);
        if (bVar2) break;
        __gnu_cxx::
        __normal_iterator<ConsumableFact_*,_std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>_>
        ::operator++(&__end1_5);
      }
      return true;
    }
    matchingFlag = (__normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                    *)__gnu_cxx::
                      __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                      ::operator*(&__end1);
    local_60._M_current =
         (RequiredFlag *)
         std::begin<std::vector<AI::RequiredFlag,std::allocator<AI::RequiredFlag>>>
                   (&(b->postconditions).requiredFlags);
    local_68 = (RequiredFlag *)
               std::end<std::vector<AI::RequiredFlag,std::allocator<AI::RequiredFlag>>>
                         (&(b->postconditions).requiredFlags);
    local_70 = (RequiredFlag)matchingFlag->_M_current;
    local_58 = std::
               find_if<__gnu_cxx::__normal_iterator<AI::RequiredFlag*,std::vector<AI::RequiredFlag,std::allocator<AI::RequiredFlag>>>,AI::areAdjacent(AI::Task&,AI::Task&)::__0>
                         (local_60,(__normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                                    )local_68,(anon_class_8_1_898bac6a_for__M_pred)local_70);
    local_50 = &local_58;
    __range1_1 = (vector<AI::RequiredValue,_std::allocator<AI::RequiredValue>_> *)
                 std::end<std::vector<AI::RequiredFlag,std::allocator<AI::RequiredFlag>>>
                           (&(b->postconditions).requiredFlags);
    bVar2 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                        *)&__range1_1);
    if ((bVar2) &&
       (bVar1 = *(byte *)((long)&matchingFlag->_M_current + 4),
       pRVar3 = __gnu_cxx::
                __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
                ::operator->(local_50), (bVar1 & 1) == (pRVar3->flag & 1U))) break;
    __gnu_cxx::
    __normal_iterator<AI::RequiredFlag_*,_std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool areAdjacent(Task& a, Task& b)
	{
		auto& precondition = a.preconditions;		

		for (auto& flag : precondition.requiredFlags)
		{
			const auto& matchingFlag = std::find_if(begin(b.postconditions.requiredFlags), end(b.postconditions.requiredFlags),
				[flag](auto& f) {return f.id == flag.id;});

			if (matchingFlag != end(b.postconditions.requiredFlags))
			{
				if (flag.flag == matchingFlag->flag)
				{
					return true;
				}
			}
		}

		for (auto& value : precondition.requiredValues)
		{
			const auto& matchingValue = std::find_if(begin(b.postconditions.requiredValues), end(b.postconditions.requiredValues),
				[value](auto& v){return v.id == value.id;});

			if (matchingValue != end(b.postconditions.requiredValues))
			{
				switch(matchingValue->op)
				{
					case ConditionOp::LessThan
						:
					{
						return canLessThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterThan
						:
					{
						return canGreaterThanSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::EqualTo
						:
					{
						return canEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::NotEqualTo
						:
					{
						return canNotEqualToSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::LessEqual
						:
					{
						return canLessEqualSatisfy(matchingValue->value, value.op, value.value);
					}
					case ConditionOp::GreaterEqual
						:
					{
						return canGreaterEqualSatisfy(matchingValue->value, value.op, value.value);
					}
				}
			}
		}

		for (auto satisfiedPredicate : precondition.satisfiedPredicates)
		{
			const auto& it = std::find_if(begin(b.postconditions.satisfiedPredicates), end(b.postconditions.satisfiedPredicates),
				[satisfiedPredicate](auto& sp){return sp.identifier == satisfiedPredicate.identifier;});	
			
			if (it != end(b.postconditions.satisfiedPredicates))
			{
				return true;
			}
		}

		for (auto flag : precondition.consumableFlags)
		{
			if (std::find(begin(b.postconditions.consumableFlags), end(b.postconditions.consumableFlags), flag)
				!= end(b.postconditions.consumableFlags))
			{
				return true;
			}
		}

		for (auto value : precondition.consumableValues)
		{
			if (std::find(begin(b.postconditions.consumableValues), end(b.postconditions.consumableValues), value)
				!= end(b.postconditions.consumableValues))
			{
				return true;
			}
		}

		for (auto vector : precondition.consumableVectors)
		{
			if (std::find(begin(b.postconditions.consumableVectors), end(b.postconditions.consumableVectors), vector)
				!= end(b.postconditions.consumableVectors))
			{
				return true;
			}
		}

		return false;
	}